

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O0

int EncodeStreamHook(void *input,void *data2)

{
  float fVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  WebPPicture *pic;
  VP8LBitWriter *bw_00;
  long lVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  WebPEncCSP WVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint8_t *puVar14;
  size_t sVar15;
  VP8LHashChain *unaff_RBP;
  long *in_RDI;
  undefined8 unaff_R14;
  VP8LBackwardRefs *unaff_R15;
  uint32_t *unaff_retaddr;
  VP8LBitWriter *in_stack_00000008;
  int in_stack_00000040;
  int in_stack_00000048;
  CrunchConfig *in_stack_00000050;
  int *in_stack_00000058;
  int in_stack_00000060;
  size_t in_stack_00000068;
  int *in_stack_00000070;
  int percent_range;
  int remaining_percent;
  int entropy_idx;
  VP8LBitWriter bw_best;
  VP8LBitWriter bw_init;
  size_t best_size;
  int idx;
  int data_size;
  int hdr_size;
  int use_near_lossless;
  int percent;
  size_t byte_position;
  int height;
  int width;
  int low_effort;
  int quality;
  WebPAuxStats *stats;
  int red_and_blue_always_zero;
  int num_crunch_configs;
  CrunchConfig *crunch_configs;
  VP8LEncoder *enc;
  VP8LBitWriter *bw;
  WebPPicture *picture;
  WebPConfig *config;
  StreamEncodeContext *params;
  int *in_stack_000002a8;
  int in_stack_000002b4;
  VP8LEncoder *in_stack_000002b8;
  int in_stack_000002c4;
  VP8LBitWriter *in_stack_000002c8;
  VP8LBitWriter *in_stack_fffffffffffffe68;
  VP8LEncoder *in_stack_fffffffffffffe70;
  VP8LBitWriter *in_stack_fffffffffffffe78;
  uint32_t num_colors;
  uint32_t *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  uint8_t *in_stack_fffffffffffffe90;
  WebPPicture *in_stack_fffffffffffffe98;
  VP8LBitWriter *in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb4;
  VP8LEncoder *in_stack_fffffffffffffeb8;
  VP8LEncoder *in_stack_fffffffffffffec8;
  uint in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  undefined1 uVar16;
  undefined3 uVar17;
  uint in_stack_fffffffffffffed8;
  undefined4 uVar18;
  byte bVar20;
  undefined2 uVar19;
  int in_stack_ffffffffffffff04;
  int in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  int in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  VP8LEncoder *in_stack_ffffffffffffff18;
  ulong local_b8;
  int local_ac;
  undefined4 local_a8;
  undefined1 local_a4 [4];
  int iVar21;
  int iVar22;
  int iVar23;
  
  lVar4 = *in_RDI;
  pic = (WebPPicture *)in_RDI[1];
  bw_00 = (VP8LBitWriter *)in_RDI[2];
  lVar5 = in_RDI[3];
  iVar2 = (int)in_RDI[0x35];
  iVar3 = *(int *)((long)in_RDI + 0x1ac);
  lVar6 = in_RDI[0x36];
  fVar1 = *(float *)(lVar4 + 4);
  uVar8 = (uint)(*(int *)(lVar4 + 8) == 0);
  iVar23 = pic->width;
  iVar22 = pic->height;
  puVar14 = (uint8_t *)VP8LBitWriterNumBytes(bw_00);
  iVar21 = 2;
  local_a4 = (undefined1  [4])0x0;
  local_a8 = 0;
  local_b8 = 0xffffffffffffffff;
  memcpy(&stack0xffffffffffffff18,bw_00,0x30);
  iVar9 = VP8LBitWriterInit((VP8LBitWriter *)in_stack_fffffffffffffe70,
                            (size_t)in_stack_fffffffffffffe68);
  if ((iVar9 == 0) ||
     ((1 < iVar2 &&
      (iVar9 = VP8LBitWriterClone(in_stack_fffffffffffffe78,
                                  (VP8LBitWriter *)in_stack_fffffffffffffe70), iVar9 == 0)))) {
    WebPEncodingSetError(pic,VP8_ENC_ERROR_OUT_OF_MEMORY);
  }
  else {
    for (local_ac = 0; num_colors = (uint32_t)((ulong)in_stack_fffffffffffffe78 >> 0x20),
        local_ac < iVar2; local_ac = local_ac + 1) {
      iVar9 = *(int *)((long)in_RDI + (long)local_ac * 0x1c + 0x20);
      iVar13 = (int)(0x61 / (long)iVar2);
      uVar18 = CONCAT13(1,(int3)in_stack_fffffffffffffed8);
      if (iVar9 != 4) {
        uVar18 = CONCAT13(iVar9 == 5,(int3)in_stack_fffffffffffffed8);
      }
      bVar20 = (byte)((uint)uVar18 >> 0x18);
      *(uint *)(lVar5 + 0x60) = (uint)bVar20;
      uVar17 = CONCAT12(1,(short)uVar18);
      if (iVar9 != 2) {
        uVar17 = CONCAT12(iVar9 == 3,(short)uVar18);
      }
      *(uint *)(lVar5 + 0x58) = (uint)(byte)((uint3)uVar17 >> 0x10);
      uVar19 = (undefined2)(CONCAT13(bVar20,uVar17) >> 0x10);
      uVar16 = (undefined1)uVar17;
      in_stack_fffffffffffffed8 = CONCAT22(uVar19,CONCAT11(1,uVar16));
      if ((iVar9 != 1) &&
         (in_stack_fffffffffffffed8 = CONCAT22(uVar19,CONCAT11(1,uVar16)), iVar9 != 3)) {
        in_stack_fffffffffffffed8 = CONCAT22(uVar19,CONCAT11(iVar9 == 5,uVar16));
      }
      *(uint *)(lVar5 + 0x5c) = in_stack_fffffffffffffed8 >> 8 & 0xff;
      if ((uVar8 == 0) && (*(int *)(lVar5 + 0x60) == 0)) {
        if (iVar3 == 0) {
          in_stack_fffffffffffffed4 = *(int *)(lVar5 + 0x5c);
        }
        else {
          in_stack_fffffffffffffed4 = 0;
        }
        *(int *)(lVar5 + 0x54) = in_stack_fffffffffffffed4;
      }
      else {
        *(undefined4 *)(lVar5 + 0x54) = 0;
      }
      *(undefined4 *)(lVar5 + 0x50) = 0;
      VP8LBackwardRefsClear((VP8LBackwardRefs *)in_stack_fffffffffffffe70);
      VP8LBackwardRefsClear((VP8LBackwardRefs *)in_stack_fffffffffffffe70);
      uVar7 = in_stack_fffffffffffffed0 & 0xffffff;
      if ((*(int *)(lVar4 + 0x5c) < 100) &&
         (uVar7 = in_stack_fffffffffffffed0 & 0xffffff, *(int *)(lVar5 + 0x60) == 0)) {
        uVar7 = CONCAT13(*(int *)(lVar5 + 0x5c) != 0,(int3)in_stack_fffffffffffffed0) ^ 0xff000000;
      }
      in_stack_fffffffffffffed0 = uVar7;
      WVar10 = (WebPEncCSP)((byte)(in_stack_fffffffffffffed0 >> 0x18) & 1);
      if (WVar10 == WEBP_YUV420) {
        *(undefined4 *)(lVar5 + 0x18) = 0;
      }
      else {
        iVar11 = AllocateTransformBuffer
                           (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4,
                            in_stack_fffffffffffffeb0);
        if (iVar11 == 0) goto LAB_00183421;
        if ((*(int *)(lVar5 + 0x18) != 2) &&
           (iVar11 = VP8ApplyNearLossless
                               (in_stack_fffffffffffffe98,
                                (int)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                                (uint32_t *)
                                CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88)),
           iVar11 == 0)) {
          WebPEncodingSetError(pic,VP8_ENC_ERROR_OUT_OF_MEMORY);
          goto LAB_00183421;
        }
        *(undefined4 *)(lVar5 + 0x18) = 2;
      }
      if (*(int *)(lVar5 + 0x60) != 0) {
        iVar11 = PaletteSort((PaletteSorting)in_stack_fffffffffffffe90,
                             (WebPPicture *)
                             CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                             in_stack_fffffffffffffe80,num_colors,
                             (uint32_t *)in_stack_fffffffffffffe70);
        if (iVar11 == 0) {
          WebPEncodingSetError(*(WebPPicture **)(lVar5 + 8),VP8_ENC_ERROR_OUT_OF_MEMORY);
          goto LAB_00183421;
        }
        iVar11 = iVar13 / 4;
        iVar12 = EncodePalette(in_stack_000002c8,in_stack_000002c4,in_stack_000002b8,
                               in_stack_000002b4,in_stack_000002a8);
        if (iVar12 == 0) goto LAB_00183421;
        iVar13 = iVar13 - iVar11;
        iVar11 = MapImageFromPalette((VP8LEncoder *)
                                     CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
        if (iVar11 == 0) goto LAB_00183421;
        if (*(int *)(lVar5 + 100) < 0x400) {
          iVar11 = BitsLog2Floor(*(uint32_t *)(lVar5 + 100));
          *(int *)(lVar5 + 0x50) = iVar11 + 1;
        }
      }
      in_stack_fffffffffffffeb0 = iVar13;
      in_stack_fffffffffffffe90 = puVar14;
      if (((*(int *)(lVar5 + 0x18) != 2) && (*(int *)(lVar5 + 0x18) != 3)) &&
         (iVar11 = MakeInputImageCopy((VP8LEncoder *)
                                      CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88))
         , in_stack_fffffffffffffeb0 = iVar13, in_stack_fffffffffffffe90 = puVar14, iVar11 == 0))
      goto LAB_00183421;
      if (*(int *)(lVar5 + 0x58) != 0) {
        ApplySubtractGreen(in_stack_fffffffffffffe70,(int)((ulong)in_stack_fffffffffffffe68 >> 0x20)
                           ,(int)in_stack_fffffffffffffe68,(VP8LBitWriter *)0x182fda);
      }
      if (*(int *)(lVar5 + 0x5c) != 0) {
        iVar13 = in_stack_fffffffffffffeb0 / 3;
        in_stack_fffffffffffffe70 =
             (VP8LEncoder *)CONCAT44((int)((ulong)in_stack_fffffffffffffe70 >> 0x20),iVar13);
        in_stack_fffffffffffffe68 = bw_00;
        iVar11 = ApplyPredictFilter(in_stack_ffffffffffffff18,in_stack_ffffffffffffff14,
                                    in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,
                                    in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,
                                    (VP8LBitWriter *)CONCAT44(iVar21,WVar10),
                                    (int)in_stack_fffffffffffffe90,(int *)CONCAT44(iVar23,iVar22));
        if (iVar11 == 0) goto LAB_00183421;
        in_stack_fffffffffffffeb0 = in_stack_fffffffffffffeb0 - iVar13;
      }
      if (*(int *)(lVar5 + 0x54) != 0) {
        iVar13 = in_stack_fffffffffffffeb0 / 2;
        in_stack_fffffffffffffe70 = (VP8LEncoder *)&stack0xffffffffffffff64;
        in_stack_fffffffffffffe68 =
             (VP8LBitWriter *)CONCAT44((int)((ulong)in_stack_fffffffffffffe68 >> 0x20),iVar13);
        iVar9 = ApplyCrossColorFilter
                          ((VP8LEncoder *)CONCAT44(iVar9,in_stack_fffffffffffffeb0),iVar13,
                           in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,
                           in_stack_fffffffffffffed0,(VP8LBitWriter *)in_stack_fffffffffffffec8,
                           in_stack_ffffffffffffff10,(int *)in_stack_ffffffffffffff18);
        if (iVar9 == 0) goto LAB_00183421;
        in_stack_fffffffffffffeb0 = in_stack_fffffffffffffeb0 - iVar13;
      }
      VP8LPutBits((VP8LBitWriter *)in_stack_fffffffffffffe70,
                  (uint32_t)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                  (int)in_stack_fffffffffffffe68);
      in_stack_fffffffffffffe78 = (VP8LBitWriter *)((long)in_RDI + (long)local_ac * 0x1c + 0x20);
      in_stack_fffffffffffffe80 = (uint32_t *)(lVar5 + 0x50);
      in_stack_fffffffffffffe88 = *(undefined4 *)(lVar5 + 0x44);
      in_stack_fffffffffffffe98 = (WebPPicture *)local_a4;
      in_stack_fffffffffffffea0 = (VP8LBitWriter *)&local_a8;
      in_stack_fffffffffffffeb8 = (VP8LEncoder *)&stack0xffffffffffffff64;
      in_stack_fffffffffffffe68 =
           (VP8LBitWriter *)CONCAT44((int)((ulong)in_stack_fffffffffffffe68 >> 0x20),(int)fVar1);
      in_stack_fffffffffffffe70 =
           (VP8LEncoder *)CONCAT44((int)((ulong)in_stack_fffffffffffffe70 >> 0x20),uVar8);
      in_stack_fffffffffffffec8 = in_stack_fffffffffffffeb8;
      puVar14 = in_stack_fffffffffffffe90;
      iVar9 = EncodeImageInternal(in_stack_00000008,unaff_retaddr,unaff_RBP,unaff_R15,
                                  SUB84(unaff_R14,4),(uint32_t)unaff_R14,in_stack_00000040,
                                  in_stack_00000048,in_stack_00000050,in_stack_00000058,
                                  in_stack_00000060,in_stack_00000068,in_stack_00000070,
                                  _remaining_percent,(WebPPicture *)bw_best.bits_,bw_best.used_,
                                  (int *)bw_best.buf_);
      if (iVar9 == 0) goto LAB_00183421;
      sVar15 = VP8LBitWriterNumBytes(bw_00);
      if (sVar15 < local_b8) {
        local_b8 = VP8LBitWriterNumBytes(bw_00);
        VP8LBitWriterSwap(in_stack_fffffffffffffea0,(VP8LBitWriter *)in_stack_fffffffffffffe98);
        if (lVar6 != 0) {
          *(undefined4 *)(lVar6 + 0x94) = 0;
          if (*(int *)(lVar5 + 0x5c) != 0) {
            *(uint *)(lVar6 + 0x94) = *(uint *)(lVar6 + 0x94) | 1;
          }
          if (*(int *)(lVar5 + 0x54) != 0) {
            *(uint *)(lVar6 + 0x94) = *(uint *)(lVar6 + 0x94) | 2;
          }
          if (*(int *)(lVar5 + 0x58) != 0) {
            *(uint *)(lVar6 + 0x94) = *(uint *)(lVar6 + 0x94) | 4;
          }
          if (*(int *)(lVar5 + 0x60) != 0) {
            *(uint *)(lVar6 + 0x94) = *(uint *)(lVar6 + 0x94) | 8;
          }
          *(undefined4 *)(lVar6 + 0x98) = *(undefined4 *)(lVar5 + 0x44);
          *(undefined4 *)(lVar6 + 0x9c) = *(undefined4 *)(lVar5 + 0x48);
          *(undefined4 *)(lVar6 + 0xb4) = *(undefined4 *)(lVar5 + 0x4c);
          *(undefined4 *)(lVar6 + 0xa0) = *(undefined4 *)(lVar5 + 0x50);
          *(undefined4 *)(lVar6 + 0xa4) = *(undefined4 *)(lVar5 + 100);
          *(int *)(lVar6 + 0xa8) = (int)local_b8 - (int)puVar14;
          *(undefined1 (*) [4])(lVar6 + 0xac) = local_a4;
          *(undefined4 *)(lVar6 + 0xb0) = local_a8;
        }
      }
      if (1 < iVar2) {
        VP8LBitWriterReset((VP8LBitWriter *)&stack0xffffffffffffff18,bw_00);
      }
    }
    VP8LBitWriterSwap(in_stack_fffffffffffffea0,(VP8LBitWriter *)in_stack_fffffffffffffe98);
  }
LAB_00183421:
  VP8LBitWriterWipeOut((VP8LBitWriter *)0x18342e);
  return (int)(*(int *)(in_RDI[1] + 0x88) == 0);
}

Assistant:

static int EncodeStreamHook(void* input, void* data2) {
  StreamEncodeContext* const params = (StreamEncodeContext*)input;
  const WebPConfig* const config = params->config_;
  const WebPPicture* const picture = params->picture_;
  VP8LBitWriter* const bw = params->bw_;
  VP8LEncoder* const enc = params->enc_;
  const CrunchConfig* const crunch_configs = params->crunch_configs_;
  const int num_crunch_configs = params->num_crunch_configs_;
  const int red_and_blue_always_zero = params->red_and_blue_always_zero_;
#if !defined(WEBP_DISABLE_STATS)
  WebPAuxStats* const stats = params->stats_;
#endif
  const int quality = (int)config->quality;
  const int low_effort = (config->method == 0);
#if (WEBP_NEAR_LOSSLESS == 1)
  const int width = picture->width;
#endif
  const int height = picture->height;
  const size_t byte_position = VP8LBitWriterNumBytes(bw);
  int percent = 2;  // for WebPProgressHook
#if (WEBP_NEAR_LOSSLESS == 1)
  int use_near_lossless = 0;
#endif
  int hdr_size = 0;
  int data_size = 0;
  int idx;
  size_t best_size = ~(size_t)0;
  VP8LBitWriter bw_init = *bw, bw_best;
  (void)data2;

  if (!VP8LBitWriterInit(&bw_best, 0) ||
      (num_crunch_configs > 1 && !VP8LBitWriterClone(bw, &bw_best))) {
    WebPEncodingSetError(picture, VP8_ENC_ERROR_OUT_OF_MEMORY);
    goto Error;
  }

  for (idx = 0; idx < num_crunch_configs; ++idx) {
    const int entropy_idx = crunch_configs[idx].entropy_idx_;
    int remaining_percent = 97 / num_crunch_configs, percent_range;
    enc->use_palette_ =
        (entropy_idx == kPalette) || (entropy_idx == kPaletteAndSpatial);
    enc->use_subtract_green_ =
        (entropy_idx == kSubGreen) || (entropy_idx == kSpatialSubGreen);
    enc->use_predict_ = (entropy_idx == kSpatial) ||
                        (entropy_idx == kSpatialSubGreen) ||
                        (entropy_idx == kPaletteAndSpatial);
    // When using a palette, R/B==0, hence no need to test for cross-color.
    if (low_effort || enc->use_palette_) {
      enc->use_cross_color_ = 0;
    } else {
      enc->use_cross_color_ = red_and_blue_always_zero ? 0 : enc->use_predict_;
    }
    // Reset any parameter in the encoder that is set in the previous iteration.
    enc->cache_bits_ = 0;
    VP8LBackwardRefsClear(&enc->refs_[0]);
    VP8LBackwardRefsClear(&enc->refs_[1]);

#if (WEBP_NEAR_LOSSLESS == 1)
    // Apply near-lossless preprocessing.
    use_near_lossless = (config->near_lossless < 100) && !enc->use_palette_ &&
                        !enc->use_predict_;
    if (use_near_lossless) {
      if (!AllocateTransformBuffer(enc, width, height)) goto Error;
      if ((enc->argb_content_ != kEncoderNearLossless) &&
          !VP8ApplyNearLossless(picture, config->near_lossless, enc->argb_)) {
        WebPEncodingSetError(picture, VP8_ENC_ERROR_OUT_OF_MEMORY);
        goto Error;
      }
      enc->argb_content_ = kEncoderNearLossless;
    } else {
      enc->argb_content_ = kEncoderNone;
    }
#else
    enc->argb_content_ = kEncoderNone;
#endif

    // Encode palette
    if (enc->use_palette_) {
      if (!PaletteSort(crunch_configs[idx].palette_sorting_type_, enc->pic_,
                       enc->palette_sorted_, enc->palette_size_,
                       enc->palette_)) {
        WebPEncodingSetError(enc->pic_, VP8_ENC_ERROR_OUT_OF_MEMORY);
        goto Error;
      }
      percent_range = remaining_percent / 4;
      if (!EncodePalette(bw, low_effort, enc, percent_range, &percent)) {
        goto Error;
      }
      remaining_percent -= percent_range;
      if (!MapImageFromPalette(enc)) goto Error;
      // If using a color cache, do not have it bigger than the number of
      // colors.
      if (enc->palette_size_ < (1 << MAX_COLOR_CACHE_BITS)) {
        enc->cache_bits_ = BitsLog2Floor(enc->palette_size_) + 1;
      }
    }
    // In case image is not packed.
    if (enc->argb_content_ != kEncoderNearLossless &&
        enc->argb_content_ != kEncoderPalette) {
      if (!MakeInputImageCopy(enc)) goto Error;
    }

    // -------------------------------------------------------------------------
    // Apply transforms and write transform data.

    if (enc->use_subtract_green_) {
      ApplySubtractGreen(enc, enc->current_width_, height, bw);
    }

    if (enc->use_predict_) {
      percent_range = remaining_percent / 3;
      if (!ApplyPredictFilter(enc, enc->current_width_, height, quality,
                              low_effort, enc->use_subtract_green_, bw,
                              percent_range, &percent)) {
        goto Error;
      }
      remaining_percent -= percent_range;
    }

    if (enc->use_cross_color_) {
      percent_range = remaining_percent / 2;
      if (!ApplyCrossColorFilter(enc, enc->current_width_, height, quality,
                                 low_effort, bw, percent_range, &percent)) {
        goto Error;
      }
      remaining_percent -= percent_range;
    }

    VP8LPutBits(bw, !TRANSFORM_PRESENT, 1);  // No more transforms.

    // -------------------------------------------------------------------------
    // Encode and write the transformed image.
    if (!EncodeImageInternal(
            bw, enc->argb_, &enc->hash_chain_, enc->refs_, enc->current_width_,
            height, quality, low_effort, &crunch_configs[idx],
            &enc->cache_bits_, enc->histo_bits_, byte_position, &hdr_size,
            &data_size, picture, remaining_percent, &percent)) {
      goto Error;
    }

    // If we are better than what we already have.
    if (VP8LBitWriterNumBytes(bw) < best_size) {
      best_size = VP8LBitWriterNumBytes(bw);
      // Store the BitWriter.
      VP8LBitWriterSwap(bw, &bw_best);
#if !defined(WEBP_DISABLE_STATS)
      // Update the stats.
      if (stats != NULL) {
        stats->lossless_features = 0;
        if (enc->use_predict_) stats->lossless_features |= 1;
        if (enc->use_cross_color_) stats->lossless_features |= 2;
        if (enc->use_subtract_green_) stats->lossless_features |= 4;
        if (enc->use_palette_) stats->lossless_features |= 8;
        stats->histogram_bits = enc->histo_bits_;
        stats->transform_bits = enc->predictor_transform_bits_;
        stats->cross_color_transform_bits = enc->cross_color_transform_bits_;
        stats->cache_bits = enc->cache_bits_;
        stats->palette_size = enc->palette_size_;
        stats->lossless_size = (int)(best_size - byte_position);
        stats->lossless_hdr_size = hdr_size;
        stats->lossless_data_size = data_size;
      }
#endif
    }
    // Reset the bit writer for the following iteration if any.
    if (num_crunch_configs > 1) VP8LBitWriterReset(&bw_init, bw);
  }
  VP8LBitWriterSwap(&bw_best, bw);

 Error:
  VP8LBitWriterWipeOut(&bw_best);
  // The hook should return false in case of error.
  return (params->picture_->error_code == VP8_ENC_OK);
}